

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAbstractTableElement.cpp
# Opt level: O1

void __thiscall
KDReports::AbstractTableElementPrivate::fillConstraints
          (AbstractTableElementPrivate *this,QTextTableFormat *tableFormat)

{
  long lVar1;
  ColumnConstraint *pCVar2;
  qreal qVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  QVector<QTextLength> constraints;
  QTextLength local_58;
  QArrayDataPointer<QTextLength> local_48;
  
  lVar1 = (this->m_constraints).d.size;
  if (lVar1 != 0) {
    local_48.d = (Data *)0x0;
    local_48.ptr = (QTextLength *)0x0;
    local_48.size = 0;
    QList<QTextLength>::reserve((QList<QTextLength> *)&local_48,lVar1);
    lVar1 = (this->m_constraints).d.size;
    if (lVar1 != 0) {
      pCVar2 = (this->m_constraints).d.ptr;
      lVar4 = 0;
      do {
        local_58.lengthType = VariableLength;
        local_58.fixedValueOrPercentage = 0.0;
        if (*(int *)(pCVar2 + lVar4 + 8) == 0) {
          qVar3 = mmToPixels(*(qreal *)(pCVar2 + lVar4));
          uVar5 = SUB84(qVar3,0);
          uVar6 = (undefined4)((ulong)qVar3 >> 0x20);
          local_58.lengthType = FixedLength;
LAB_001355d5:
          local_58.fixedValueOrPercentage = (qreal)CONCAT44(uVar6,uVar5);
        }
        else if (*(int *)(pCVar2 + lVar4 + 8) == 1) {
          uVar5 = (undefined4)*(undefined8 *)(pCVar2 + lVar4);
          uVar6 = (undefined4)((ulong)*(undefined8 *)(pCVar2 + lVar4) >> 0x20);
          local_58.lengthType = PercentageLength;
          goto LAB_001355d5;
        }
        QtPrivate::QPodArrayOps<QTextLength>::emplace<QTextLength_const&>
                  ((QPodArrayOps<QTextLength> *)&local_48,local_48.size,&local_58);
        lVar4 = lVar4 + 0x10;
      } while (lVar1 << 4 != lVar4);
    }
    QTextFormat::setProperty((int)tableFormat,(QList *)0x4101);
    QArrayDataPointer<QTextLength>::~QArrayDataPointer(&local_48);
  }
  return;
}

Assistant:

void KDReports::AbstractTableElementPrivate::fillConstraints(QTextTableFormat *tableFormat) const
{
    if (!m_constraints.isEmpty()) {
        QVector<QTextLength> constraints;
        constraints.reserve(m_constraints.size());
        for (const auto &c : m_constraints) {
            QTextLength length; // Variable by default
            switch (c.unit) {
            case Millimeters:
                length = QTextLength(QTextLength::FixedLength, mmToPixels(c.width));
                break;
            case Percent:
                length = QTextLength(QTextLength::PercentageLength, c.width);
                break;
            }
            constraints.append(length);
        }
        tableFormat->setColumnWidthConstraints(constraints);
    }
}